

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O2

void __thiscall
jsoncons::jsonschema::
properties_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
update_patch(properties_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *patch,
            json_pointer *instance_location,
            basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *default_value)

{
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> j;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_70;
  string_type local_60;
  string_view_type local_40;
  undefined1 local_30 [24];
  
  local_70.common_ = (common_storage)0x4;
  local_30._0_8_ =
       (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        *)0x2;
  local_30._8_8_ = "op";
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::try_emplace<char_const(&)[4]>
            ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
              *)&local_60,
             (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)&local_70.common_,
             (string_view_type *)local_30,(char (*) [4])0x6a4e53);
  local_40._M_len = 4;
  local_40._M_str = "path";
  jsonpointer::basic_json_pointer<char>::to_string_abi_cxx11_(&local_60,instance_location);
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::try_emplace<std::__cxx11::string>
            ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
              *)local_30,
             (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)&local_70.common_,
             &local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  local_30._0_8_ = &DAT_00000005;
  local_30._8_8_ = "value";
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
  try_emplace<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
              *)&local_60,
             (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)&local_70.common_,
             (string_view_type *)local_30,default_value);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::push_back
            (patch,(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   &local_70.common_);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_70.common_);
  return;
}

Assistant:

void update_patch(Json& patch, const jsonpointer::json_pointer& instance_location, Json&& default_value) const
        {
            Json j;
            j.try_emplace("op", "add"); 
            j.try_emplace("path", instance_location.string()); 
            j.try_emplace("value", std::forward<Json>(default_value)); 
            patch.push_back(std::move(j));
        }